

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneGenericNameMatchInfo::getTimeZoneID
          (TimeZoneGenericNameMatchInfo *this,int32_t index,UnicodeString *tzID)

{
  GMatchInfo *this_00;
  ConstChar16Ptr local_30;
  long *local_28;
  GMatchInfo *minfo;
  UnicodeString *tzID_local;
  TimeZoneGenericNameMatchInfo *pTStack_10;
  int32_t index_local;
  TimeZoneGenericNameMatchInfo *this_local;
  
  minfo = (GMatchInfo *)tzID;
  tzID_local._4_4_ = index;
  pTStack_10 = this;
  local_28 = (long *)UVector::elementAt(this->fMatches,index);
  this_00 = minfo;
  if ((local_28 == (long *)0x0) || (*(long *)(*local_28 + 8) == 0)) {
    UnicodeString::setToBogus((UnicodeString *)minfo);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(&local_30,*(char16_t **)(*local_28 + 8));
    UnicodeString::setTo((UnicodeString *)this_00,'\x01',&local_30,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_30);
  }
  return (UnicodeString *)minfo;
}

Assistant:

UnicodeString&
TimeZoneGenericNameMatchInfo::getTimeZoneID(int32_t index, UnicodeString& tzID) const {
    GMatchInfo *minfo = (GMatchInfo *)fMatches->elementAt(index);
    if (minfo != NULL && minfo->gnameInfo->tzID != NULL) {
        tzID.setTo(TRUE, minfo->gnameInfo->tzID, -1);
    } else {
        tzID.setToBogus();
    }
    return tzID;
}